

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O2

void __thiscall
Centaurus::Grammar<wchar_t>::print_catn(Grammar<wchar_t> *this,wostream *os,Identifier *id)

{
  mapped_type *this_00;
  CompositeATN<wchar_t> catn;
  undefined1 auStack_58 [72];
  
  CompositeATN<wchar_t>::CompositeATN((CompositeATN<wchar_t> *)auStack_58,this);
  this_00 = std::__detail::
            _Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<wchar_t>_>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<wchar_t>_>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::at((_Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<wchar_t>_>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<wchar_t>_>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  *)(auStack_58 + 8),id);
  CATNMachine<wchar_t>::print(this_00,os,&id->m_id);
  CompositeATN<wchar_t>::~CompositeATN((CompositeATN<wchar_t> *)auStack_58);
  return;
}

Assistant:

void Grammar<TCHAR>::print_catn(std::wostream& os, const Identifier& id) const
{
    CompositeATN<TCHAR> catn(*this);

    catn[id].print(os, id.str());
}